

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O2

ssize_t __thiscall
CVmMemorySourceList::read(CVmMemorySourceList *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  if (this->len_ < (long)__buf + this->cur_block_ofs_ + this->cur_block_->ofs) {
    return 1;
  }
  iVar1 = readc(this,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  return (ulong)((void *)(long)iVar1 != __buf);
}

Assistant:

int read(void *buf, size_t len)
    {
        /* 
         *   if the request would take us past the current content length,
         *   fail immediately, since we know we can't satisfy the request 
         */
        if (cur_block_->ofs + cur_block_ofs_ + (long)len > len_)
            return 1;

        /* 
         *   do the read; return success == 0 if the amount read exactly
         *   matches the requested length 
         */
        return (size_t)readc(buf, len) != len;
    }